

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_sample.cpp
# Opt level: O2

void duckdb::DuckDBTableSampleFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  _func_int **pp_Var1;
  FunctionData *pFVar2;
  GlobalTableFunctionState *pGVar3;
  _Alloc_hider _Var4;
  pointer pBVar5;
  pointer pDVar6;
  NotImplementedException *this;
  GlobalTableFunctionState *this_00;
  allocator local_49;
  string local_48;
  
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  if (*(char *)(pFVar2[4]._vptr_FunctionData + 2) != '\x01') {
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Unimplemented catalog type for pragma_table_sample",&local_49);
    NotImplementedException::NotImplementedException(this,&local_48);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = pGVar3 + 2;
  if (pGVar3[2]._vptr_GlobalTableFunctionState == (_func_int **)0x0) {
    (**(code **)(*pFVar2[4]._vptr_FunctionData + 0x90))(&local_48);
    _Var4._M_p = local_48._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)0x0;
    pp_Var1 = this_00->_vptr_GlobalTableFunctionState;
    this_00->_vptr_GlobalTableFunctionState = (_func_int **)_Var4._M_p;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
      if ((_func_int **)local_48._M_dataplus._M_p != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_48._M_dataplus._M_p + 8))();
      }
      _Var4._M_p = (pointer)this_00->_vptr_GlobalTableFunctionState;
    }
    if ((_func_int **)_Var4._M_p == (_func_int **)0x0) {
      return;
    }
  }
  pBVar5 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this_00);
  (*pBVar5->_vptr_BlockingSample[6])(&local_48,pBVar5);
  if ((_func_int **)local_48._M_dataplus._M_p != (_func_int **)0x0) {
    pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_48);
    DataChunk::Copy(pDVar6,output,0);
    pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_48);
    pGVar3[1]._vptr_GlobalTableFunctionState =
         (_func_int **)((long)pGVar3[1]._vptr_GlobalTableFunctionState + pDVar6->count);
  }
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_48);
  return;
}

Assistant:

static void DuckDBTableSampleFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<DuckDBTableSampleFunctionData>();
	auto &state = data_p.global_state->Cast<DuckDBTableSampleOperatorData>();
	switch (bind_data.entry.type) {
	case CatalogType::TABLE_ENTRY:
		DuckDBTableSampleTable(context, state, bind_data.entry.Cast<TableCatalogEntry>(), output);
		break;
	default:
		throw NotImplementedException("Unimplemented catalog type for pragma_table_sample");
	}
}